

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  ExpressionList *pEVar1;
  Name *pNVar2;
  ulong uVar3;
  address64_t aVar4;
  Name memory;
  Block *pBVar5;
  Index IVar6;
  Index index;
  Memory *pMVar7;
  LocalGet *pLVar8;
  LocalGet *pLVar9;
  Store *pSVar10;
  Const *pCVar11;
  Binary *pBVar12;
  ulong extraout_RDX;
  uint bytes;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Address offset;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  size_t sVar13;
  char *pcVar14;
  initializer_list<wasm::Expression_*> local_90;
  LocalSet *local_80;
  LocalSet *local_78;
  Block *local_70;
  string_view *local_68;
  Address local_60;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_58;
  uintptr_t local_50;
  Index local_44;
  Builder local_40;
  Builder builder;
  
  uVar3 = (curr->align).addr;
  if (uVar3 == 0) {
    return (Expression *)curr;
  }
  if (uVar3 == curr->bytes) {
    return (Expression *)curr;
  }
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  if ((curr->value->type).id != 2) {
    __assert_fail("curr->value->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                  ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
  }
  pNVar2 = &curr->memory;
  pMVar7 = Module::getMemory(local_40.wasm,(Name)(curr->memory).super_IString.str);
  local_50 = (pMVar7->addressType).id;
  IVar6 = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Type)local_50);
  index = Builder::addVar((this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Type)0x2);
  builder.wasm._4_4_ = IVar6;
  local_80 = Builder::makeLocalSet(&local_40,IVar6,curr->ptr);
  local_44 = index;
  local_78 = Builder::makeLocalSet(&local_40,index,curr->value);
  local_90._M_len = 2;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_90._M_array = (iterator)&local_80;
  local_70 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_40,&local_90,type);
  local_68 = (string_view *)pNVar2;
  if (curr->bytes == '\x04') {
    aVar4 = (curr->align).addr;
    if (aVar4 != 2) {
      if (aVar4 != 1) {
        handle_unreachable("invalid alignment",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xe9);
      }
      pEVar1 = &local_70->list;
      local_60.addr = (curr->offset).addr;
      local_58 = &pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      ;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar8->index = builder.wasm._4_4_;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_50;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar9->index = local_44;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pSVar10 = Builder::makeStore(&local_40,1,local_60,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                   (Type)0x2,(Name)(pNVar2->super_IString).str);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar8->index = builder.wasm._4_4_;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_50;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar9->index = local_44;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_40,8);
      pBVar12 = Builder::makeBinary(&local_40,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_40,1,(Address)(aVar4 + 1),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)(pNVar2->super_IString).str
                                  );
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_58,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar8->index = builder.wasm._4_4_;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_50;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar9->index = local_44;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_40,0x10);
      pBVar12 = Builder::makeBinary(&local_40,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_40,1,(Address)(aVar4 + 2),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)*local_68);
      this_00 = local_58;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_58,(Expression *)pSVar10);
      aVar4 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar8->index = builder.wasm._4_4_;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           local_50;
      pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar9->index = local_44;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar11 = Builder::makeConst<int>(&local_40,0x18);
      pBVar12 = Builder::makeBinary(&local_40,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      pSVar10 = Builder::makeStore(&local_40,1,(Address)(aVar4 + 3),1,(Expression *)pLVar8,
                                   (Expression *)pBVar12,(Type)0x2,(Name)*local_68);
      goto LAB_00962181;
    }
    pEVar1 = &local_70->list;
    local_60.addr = (curr->offset).addr;
    local_58 = &pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar8->index = builder.wasm._4_4_;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_50;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar9->index = local_44;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pSVar10 = Builder::makeStore(&local_40,2,local_60,2,(Expression *)pLVar8,(Expression *)pLVar9,
                                 (Type)0x2,(Name)(pNVar2->super_IString).str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pSVar10);
    offset.addr = (curr->offset).addr + 2;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar8->index = builder.wasm._4_4_;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_50;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar9->index = local_44;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pCVar11 = Builder::makeConst<int>(&local_40,0x10);
    pBVar12 = Builder::makeBinary(&local_40,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
    sVar13 = ((string_view *)&local_68->_M_len)->_M_len;
    pcVar14 = local_68->_M_str;
    bytes = 2;
  }
  else {
    if (curr->bytes != '\x02') {
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                         ,0xec);
    }
    local_58 = &(local_70->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_60.addr = (curr->offset).addr;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar8->index = builder.wasm._4_4_;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_50;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    IVar6 = local_44;
    pLVar9->index = local_44;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pSVar10 = Builder::makeStore(&local_40,1,local_60,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                 (Type)0x2,(Name)(pNVar2->super_IString).str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_58,(Expression *)pSVar10);
    offset.addr = (curr->offset).addr + 1;
    pLVar8 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar8->index = builder.wasm._4_4_;
    (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_50;
    pLVar9 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar9->index = IVar6;
    (pLVar9->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    pCVar11 = Builder::makeConst<int>(&local_40,8);
    pBVar12 = Builder::makeBinary(&local_40,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
    sVar13 = ((string_view *)&local_68->_M_len)->_M_len;
    pcVar14 = local_68->_M_str;
    bytes = 1;
  }
  memory.super_IString.str._M_str = pcVar14;
  memory.super_IString.str._M_len = sVar13;
  pSVar10 = Builder::makeStore(&local_40,bytes,offset,bytes,(Expression *)pLVar8,
                               (Expression *)pBVar12,(Type)0x2,memory);
  this_00 = local_58;
LAB_00962181:
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (this_00,(Expression *)pSVar10);
  pBVar5 = local_70;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pSVar10;
  Block::finalize(local_70,type_,Unknown);
  return (Expression *)pBVar5;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto addressType = mem->addressType;
    auto tempPtr = builder.addVar(getFunction(), addressType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, addressType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, addressType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }